

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void woff2::anon_unknown_2::WriteLong
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,int value)

{
  value_type local_18;
  value_type local_17;
  value_type local_16;
  value_type local_15;
  int local_14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_10;
  int value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  local_15 = (value_type)((uint)value >> 0x18);
  local_14 = value;
  pvStack_10 = out;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(out,&local_15);
  local_16 = (value_type)((uint)local_14 >> 0x10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_10,&local_16);
  local_17 = (value_type)((uint)local_14 >> 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_10,&local_17);
  local_18 = (value_type)local_14;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvStack_10,&local_18);
  return;
}

Assistant:

void WriteLong(std::vector<uint8_t>* out, int value) {
  out->push_back((value >> 24) & 255);
  out->push_back((value >> 16) & 255);
  out->push_back((value >> 8) & 255);
  out->push_back(value & 255);
}